

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O1

void __thiscall mp::NLFeeder_Easy::FillObjNonzeros(NLFeeder_Easy *this)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  uint uVar1;
  double *pdVar2;
  _Bit_type *p_Var3;
  size_t *psVar4;
  int *piVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  size_t pos_end;
  size_t sVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  size_t sVar15;
  double dVar16;
  double dVar17;
  
  this_00 = &this->obj_grad_supp_;
  std::vector<bool,_std::allocator<bool>_>::resize(this_00,(long)(this->nlme_).vars_.num_col_,false)
  ;
  pdVar2 = (this->nlme_).obj_c_;
  if ((pdVar2 != (double *)0x0) && (uVar7 = (ulong)(this->nlme_).vars_.num_col_, uVar7 != 0)) {
    p_Var3 = (this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
    do {
      uVar8 = uVar7 - 1;
      dVar16 = pdVar2[uVar8];
      uVar7 = uVar7 + 0x3e;
      if (-1 < (long)uVar8) {
        uVar7 = uVar8;
      }
      lVar13 = (long)uVar7 >> 6;
      uVar14 = (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001);
      uVar7 = 1L << ((byte)uVar8 & 0x3f);
      if ((dVar16 != 0.0) || (NAN(dVar16))) {
        uVar7 = uVar7 | p_Var3[lVar13 + uVar14 + 0xffffffffffffffff];
      }
      else {
        uVar7 = ~uVar7 & p_Var3[lVar13 + uVar14 + 0xffffffffffffffff];
      }
      p_Var3[lVar13 + uVar14 + 0xffffffffffffffff] = uVar7;
      uVar7 = uVar8;
    } while (uVar8 != 0);
  }
  sVar11 = (this->nlme_).Q_.num_nz_;
  if ((sVar11 != 0) && (uVar7 = (ulong)(this->nlme_).vars_.num_col_, uVar7 != 0)) {
    psVar4 = (this->nlme_).Q_.start_;
    piVar5 = (this->nlme_).Q_.index_;
    p_Var3 = (this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
    do {
      sVar15 = psVar4[uVar7 - 1];
      uVar8 = uVar7 - 1;
      if (sVar15 != sVar11) {
        uVar7 = uVar7 + 0x3e;
        if (-1 < (long)uVar8) {
          uVar7 = uVar8;
        }
        do {
          puVar10 = p_Var3 + ((long)uVar7 >> 6) +
                             (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) +
                             0xffffffffffffffff;
          *puVar10 = *puVar10 | 1L << ((byte)uVar8 & 0x3f);
          iVar12 = piVar5[sVar15];
          uVar9 = (ulong)iVar12;
          uVar14 = uVar9 + 0x3f;
          if (-1 < (long)uVar9) {
            uVar14 = uVar9;
          }
          puVar10 = p_Var3 + ((long)uVar14 >> 6) +
                             (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) +
                             0xffffffffffffffff;
          *puVar10 = *puVar10 | 1L << ((byte)iVar12 & 0x3f);
          sVar15 = sVar15 + 1;
        } while (sVar11 != sVar15);
      }
      sVar11 = psVar4[uVar8];
      uVar7 = uVar8;
    } while (uVar8 != 0);
  }
  puVar10 = (this->obj_grad_supp_).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  puVar6 = (this->obj_grad_supp_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (this->obj_grad_supp_).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  uVar7 = 0;
  if (uVar1 != 0 || puVar10 != puVar6) {
    dVar16 = 0.0;
    uVar8 = 0;
    do {
      dVar17 = 1.0;
      if ((*puVar10 >> (uVar8 & 0x3f) & 1) == 0) {
        dVar17 = 0.0;
      }
      dVar16 = dVar16 + dVar17;
      iVar12 = (int)uVar8;
      puVar10 = puVar10 + (iVar12 == 0x3f);
      uVar8 = (ulong)(iVar12 + 1);
      if (iVar12 == 0x3f) {
        uVar8 = uVar7;
      }
    } while ((uint)uVar8 != uVar1 || puVar10 != puVar6);
    uVar7 = (long)(dVar16 - 9.223372036854776e+18) & (long)dVar16 >> 0x3f | (long)dVar16;
  }
  (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_obj_nonzeros = uVar7;
  return;
}

Assistant:

void FillObjNonzeros() {
    obj_grad_supp_.resize(NLME().NumCols());
    // Linear part -- if provided
    if (NLME().ObjCoefficients()) {
      for (auto i=NLME().NumCols(); i--; )
        obj_grad_supp_[i] = (NLME().ObjCoefficients()[i]);
    }
    // QP part
    auto Q = NLME().Hessian();
    if (Q.num_nz_) {
      assert(Q.num_colrow_ == NLME().NumCols());
      auto pos_end = Q.num_nz_;
      for (auto i=NLME().NumCols(); i--; ) {
        for (auto pos=Q.start_[i]; pos!=pos_end; ++pos) {
          obj_grad_supp_[i] = true;             // x
          obj_grad_supp_[Q.index_[pos]] = true; // y
        }
        pos_end = Q.start_[i];
      }
    }
    header_.num_obj_nonzeros
        = std::accumulate(obj_grad_supp_.begin(),
                          obj_grad_supp_.end(), 0.0);
  }